

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::copyAppend
          (QGenericArrayOps<QList<QGraphicsItem_*>_> *this,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  QList<QGraphicsItem_*> *pQVar2;
  bool bVar3;
  
  if (n != 0) {
    pQVar2 = (this->super_QArrayDataPointer<QList<QGraphicsItem_*>_>).ptr;
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      QArrayDataPointer<QGraphicsItem_*>::QArrayDataPointer
                (&pQVar2[(this->super_QArrayDataPointer<QList<QGraphicsItem_*>_>).size].d,&t->d);
      pqVar1 = &(this->super_QArrayDataPointer<QList<QGraphicsItem_*>_>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(qsizetype n, parameter_type t)
    {
        Q_ASSERT(!this->isShared() || n == 0);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        if (!n)
            return;

        T *data = this->begin();
        while (n--) {
            new (data + this->size) T(t);
            ++this->size;
        }
    }